

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

int nifti_extension_size(nifti_image *nim)

{
  uint local_20;
  int local_1c;
  int size;
  int c;
  nifti_image *nim_local;
  
  local_20 = 0;
  if ((nim == (nifti_image *)0x0) || (nim->num_ext < 1)) {
    nim_local._4_4_ = 0;
  }
  else {
    if (2 < g_opts.debug) {
      fprintf(_stderr,"-d ext sizes:");
    }
    for (local_1c = 0; local_1c < nim->num_ext; local_1c = local_1c + 1) {
      local_20 = nim->ext_list[local_1c].esize + local_20;
      if (2 < g_opts.debug) {
        fprintf(_stderr,"  %d",(ulong)(uint)nim->ext_list[local_1c].esize);
      }
    }
    if (2 < g_opts.debug) {
      fprintf(_stderr," (total = %d)\n",(ulong)local_20);
    }
    nim_local._4_4_ = local_20;
  }
  return nim_local._4_4_;
}

Assistant:

int nifti_extension_size(nifti_image *nim)
{
   int c, size = 0;

   if( !nim || nim->num_ext <= 0 ) return 0;

   if( g_opts.debug > 2 ) fprintf(stderr,"-d ext sizes:");

   for ( c = 0; c < nim->num_ext; c++ ){
      size += nim->ext_list[c].esize;
      if( g_opts.debug > 2 ) fprintf(stderr,"  %d",nim->ext_list[c].esize);
   }

   if( g_opts.debug > 2 ) fprintf(stderr," (total = %d)\n",size);

   return size;
}